

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseExpr(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  Parser *this_local;
  
  bVar1 = consume(in_RSI,LEFT_BRACE);
  if ((bVar1) || (bVar1 = consume(in_RSI,EQUAL_GREATER), bVar1)) {
    parseBlockExpr(this);
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  bVar1 = consume(in_RSI,IF);
  if (bVar1) {
    parseIfExpr(this);
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  bVar1 = consume(in_RSI,WHILE);
  if (!bVar1) {
    bVar1 = consume(in_RSI,FOR);
    if (bVar1) {
      parseForExpr(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    bVar1 = consume(in_RSI,SWITCH);
    if (!bVar1) {
      parsePrecAssignment(this);
      return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
             (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
    }
    parseSwitchExpr(this);
    return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
           (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
  }
  parseWhileExpr(this);
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseExpr() {
        // Expression with block?
        if (consume(TokenType::LEFT_BRACE) ||
            consume(TokenType::EQUAL_GREATER)) return parseBlockExpr();
        if (consume(TokenType::IF))            return parseIfExpr();
        if (consume(TokenType::WHILE))         return parseWhileExpr();
        if (consume(TokenType::FOR))           return parseForExpr();
        if (consume(TokenType::SWITCH))        return parseSwitchExpr();

        // Expression without block. Start at the lowest precedence.
        return parsePrecAssignment();
    }